

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O1

monst * mk_roamer(permonst *ptr,aligntyp alignment,level *lev,xchar x,xchar y,boolean peaceful)

{
  aligntyp aVar1;
  monst *pmVar2;
  
  aVar1 = u.ualign.type;
  if (ptr == mons + 0x11f || ptr == mons + 0x7f) {
    pmVar2 = lev->monsters[x][y];
    if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
      rloc(lev,pmVar2,'\0');
    }
    pmVar2 = makemon(ptr,lev,(int)x,(int)y,0);
    if (pmVar2 != (monst *)0x0) {
      pmVar2->field_0x74 = alignment;
      if ((peaceful == '\0') && (aVar1 == alignment)) {
        pmVar2->field_0x75 = 1;
      }
      pmVar2->mtrapseen = 0xffffffff;
      *(uint *)&pmVar2->field_0x60 =
           *(uint *)&pmVar2->field_0x60 & 0xffb7ffff | 0x4000000 | (uint)(peaceful & 1) << 0x16;
      set_malign(pmVar2);
      return pmVar2;
    }
  }
  return (monst *)0x0;
}

Assistant:

struct monst *mk_roamer(const struct permonst *ptr, aligntyp alignment,
			struct level *lev, xchar x, xchar y, boolean peaceful)
{
	struct monst *roamer;
	boolean coaligned = (u.ualign.type == alignment);

	if (ptr != &mons[PM_ALIGNED_PRIEST] && ptr != &mons[PM_ANGEL])
		return NULL;
	
	if (MON_AT(lev, x, y)) rloc(lev, m_at(lev, x, y), FALSE);	/* insurance */

	if (!(roamer = makemon(ptr, lev, x, y, NO_MM_FLAGS)))
		return NULL;

	EPRI(roamer)->shralign = alignment;
	if (coaligned && !peaceful)
		EPRI(roamer)->renegade = TRUE;
	/* roamer->ispriest == FALSE naturally */
	roamer->isminion = TRUE;	/* borrowing this bit */
	roamer->mtrapseen = ~0;		/* traps are known */
	roamer->mpeaceful = peaceful;
	roamer->msleeping = 0;
	set_malign(roamer); /* peaceful may have changed */

	/* MORE TO COME */
	return roamer;
}